

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_iejoin.cpp
# Opt level: O2

idx_t duckdb::NextValid(ValidityMask *bits,idx_t j,idx_t n)

{
  unsigned_long *puVar1;
  sbyte sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (n <= j) {
    return n;
  }
  uVar3 = (uint)j & 0x3f;
  uVar4 = (ulong)uVar3;
  puVar1 = (bits->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar5 = 0xffffffffffffffff;
  if (puVar1 != (unsigned_long *)0x0) {
    uVar5 = puVar1[j >> 6];
  }
  sVar2 = (sbyte)uVar3;
  uVar8 = n + 0x3f >> 6;
  uVar5 = (uVar5 >> sVar2) << sVar2;
  uVar7 = j >> 6;
  do {
    uVar6 = uVar7;
    uVar7 = uVar6 + 1;
    if (uVar8 <= uVar7) {
LAB_009b8b2b:
      uVar7 = n;
      if (n < j) {
        uVar7 = j;
      }
      while( true ) {
        if (n <= j) {
          return uVar7;
        }
        if ((uVar5 >> (uVar4 & 0x3f) & 1) != 0) break;
        uVar4 = uVar4 + 1;
        j = j + 1;
      }
      return j;
    }
    if (uVar5 == 0) {
      j = (j - uVar4) + 0x40;
    }
    else {
      for (; uVar4 != 0x40; uVar4 = uVar4 + 1) {
        if ((uVar5 >> (uVar4 & 0x3f) & 1) != 0) {
          if (uVar7 < uVar8) {
            return j;
          }
          goto LAB_009b8b2b;
        }
        j = j + 1;
      }
    }
    uVar4 = 0;
    uVar5 = 0xffffffffffffffff;
    if (puVar1 != (unsigned_long *)0x0) {
      uVar5 = puVar1[uVar6 + 1];
      uVar4 = 0;
    }
  } while( true );
}

Assistant:

static idx_t NextValid(const ValidityMask &bits, idx_t j, const idx_t n) {
	if (j >= n) {
		return n;
	}

	// We can do a first approximation by checking entries one at a time
	// which gives 64:1.
	idx_t entry_idx, idx_in_entry;
	bits.GetEntryIndex(j, entry_idx, idx_in_entry);
	auto entry = bits.GetValidityEntry(entry_idx++);

	// Trim the bits before the start position
	entry &= (ValidityMask::ValidityBuffer::MAX_ENTRY << idx_in_entry);

	// Check the non-ragged entries
	for (const auto entry_count = bits.EntryCount(n); entry_idx < entry_count; ++entry_idx) {
		if (entry) {
			for (; idx_in_entry < bits.BITS_PER_VALUE; ++idx_in_entry, ++j) {
				if (bits.RowIsValid(entry, idx_in_entry)) {
					return j;
				}
			}
		} else {
			j += bits.BITS_PER_VALUE - idx_in_entry;
		}

		entry = bits.GetValidityEntry(entry_idx);
		idx_in_entry = 0;
	}

	// Check the final entry
	for (; j < n; ++idx_in_entry, ++j) {
		if (bits.RowIsValid(entry, idx_in_entry)) {
			return j;
		}
	}

	return j;
}